

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation.cpp
# Opt level: O2

void __thiscall QBlendStyleAnimation::updateCurrentTime(QBlendStyleAnimation *this,int time)

{
  uint uVar1;
  uint uVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Format FVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  double dVar15;
  float fVar16;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QImage local_50 [24];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QStyleAnimation::updateCurrentTime((QStyleAnimation *)this,time);
  iVar4 = (**(code **)(*(long *)this + 0x60))(this);
  if (iVar4 < 1) {
    if (0 < time) goto LAB_00382c87;
  }
  else {
    if (*(int *)(this + 0x24) == 1) {
      iVar4 = (**(code **)(*(long *)this + 0x60))(this);
      iVar4 = time % iVar4;
      time = iVar4 * 2;
      iVar5 = (**(code **)(*(long *)this + 0x60))(this);
      if (iVar5 < time) {
        iVar5 = (**(code **)(*(long *)this + 0x60))(this);
        time = (iVar5 - iVar4) * 2;
      }
    }
    iVar4 = (**(code **)(*(long *)this + 0x60))(this);
    fVar16 = (float)time / (float)iVar4;
    if ((*(int *)(this + 0x24) != 0) ||
       (iVar4 = (**(code **)(*(long *)this + 0x60))(this), time <= iVar4)) goto LAB_00382c9b;
LAB_00382c87:
    QAbstractAnimation::stop();
  }
  fVar16 = 1.0;
LAB_00382c9b:
  cVar3 = QImage::isNull();
  if ((cVar3 == '\0') && (cVar3 = QImage::isNull(), cVar3 == '\0')) {
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage((QImage *)&local_68);
    uVar6 = QImage::width();
    iVar4 = QImage::height();
    lVar8 = QImage::bytesPerLine();
    iVar5 = QImage::depth();
    if (iVar5 == 0x20) {
      iVar13 = (int)((float)((uint)(fVar16 * 256.0) & 0x80000000 | (uint)DAT_005eba40) +
                    fVar16 * 256.0);
      iVar12 = 0x100 - iVar13;
      FVar7 = QImage::format();
      QImage::QImage(local_50,uVar6,iVar4,FVar7);
      QImage::operator=((QImage *)&local_68,local_50);
      QImage::~QImage(local_50);
      dVar15 = (double)QImage::devicePixelRatio();
      QImage::setDevicePixelRatio(dVar15);
      lVar9 = QImage::bits();
      lVar10 = QImage::bits();
      lVar11 = QImage::bits();
      iVar5 = 0;
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      for (; iVar5 != iVar4; iVar5 = iVar5 + 1) {
        for (uVar14 = 0; uVar6 != uVar14; uVar14 = uVar14 + 1) {
          uVar1 = *(uint *)(lVar10 + uVar14 * 4);
          uVar2 = *(uint *)(lVar11 + uVar14 * 4);
          *(uint *)(lVar9 + uVar14 * 4) =
               (uVar2 & 0xff) * iVar13 + (uVar1 & 0xff) * iVar12 >> 8 & 0xff |
               (uVar2 >> 8 & 0xff) * iVar13 + (uVar1 >> 8 & 0xff) * iVar12 & 0xff00 |
               ((uVar2 >> 0x18) * iVar13 + (uVar1 >> 0x18) * iVar12 & 0xff00) << 0x10 |
               ((uVar2 >> 0x10 & 0xff) * iVar13 + (uVar1 >> 0x10 & 0xff) * iVar12 & 0xff00) << 8;
        }
        lVar9 = lVar9 + lVar8;
        lVar10 = lVar10 + lVar8;
        lVar11 = lVar11 + lVar8;
      }
    }
  }
  else {
    QImage::QImage((QImage *)&local_68);
  }
  QImage::operator=((QImage *)(this + 0x58),(QImage *)&local_68);
  QImage::~QImage((QImage *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QBlendStyleAnimation::updateCurrentTime(int time)
{
    QStyleAnimation::updateCurrentTime(time);

    float alpha = 1.0;
    if (duration() > 0) {
        if (_type == Pulse) {
            time = time % duration() * 2;
            if (time > duration())
                time = duration() * 2 - time;
        }

        alpha = time / static_cast<float>(duration());

        if (_type == Transition && time > duration()) {
            alpha = 1.0;
            stop();
        }
    } else if (time > 0) {
        stop();
    }

    _current = blendedImage(_start, _end, alpha);
}